

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

uint __thiscall
Js::EntryPointInfo::PopulateLineInfo(EntryPointInfo *this,void *pInfo,FunctionBody *body)

{
  uint statementIndex_00;
  ULONG UVar1;
  int iVar2;
  ULONG UVar3;
  NativeEntryPointData *this_00;
  NativeOffsetMapListType *this_01;
  Type *pTVar4;
  uint32 statementIndex;
  NativeOffsetMap *map;
  int i;
  int count;
  int j;
  int lineNumber;
  ULONG functionLineNumber;
  LineNumberInfo *pLineInfo;
  NativeOffsetMapListType *nativeOffsetMaps;
  FunctionBody *body_local;
  void *pInfo_local;
  EntryPointInfo *this_local;
  
  this_00 = GetNativeEntryPointData(this);
  this_01 = NativeEntryPointData::GetNativeOffsetMaps(this_00);
  UVar1 = ParseableFunctionInfo::GetLineNumber(&body->super_ParseableFunctionInfo);
  *(undefined4 *)pInfo = 0;
  *(ULONG *)((long)pInfo + 4) = UVar1;
  i = 1;
  iVar2 = JsUtil::
          ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
          ::Count(&this_01->
                   super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
                 );
  for (map._4_4_ = 0; map._4_4_ < iVar2; map._4_4_ = map._4_4_ + 1) {
    pTVar4 = JsUtil::
             List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this_01,map._4_4_);
    statementIndex_00 = pTVar4->statementIndex;
    if (statementIndex_00 == 0) {
      *(Type *)((long)pInfo + (long)i * 8) = (pTVar4->nativeOffsetSpan).begin;
      *(ULONG *)((long)pInfo + (long)i * 8 + 4) = UVar1;
      i = i + 1;
    }
    UVar3 = FunctionBody::GetSourceLineNumber(body,statementIndex_00);
    if (UVar3 != 0) {
      *(Type *)((long)pInfo + (long)i * 8) = (pTVar4->nativeOffsetSpan).end;
      *(ULONG *)((long)pInfo + (long)i * 8 + 4) = UVar3;
      i = i + 1;
    }
  }
  return i;
}

Assistant:

uint EntryPointInfo::PopulateLineInfo(void* pInfo, FunctionBody* body)
    {
        auto& nativeOffsetMaps = this->GetNativeEntryPointData()->GetNativeOffsetMaps();
        LineNumberInfo* pLineInfo = (LineNumberInfo*)pInfo;
        ULONG functionLineNumber = body->GetLineNumber();
        pLineInfo[0].Offset = 0;
        pLineInfo[0].LineNumber = functionLineNumber;

        int lineNumber = 0;
        int j = 1; // start with 1 since offset 0 has already been populated with function line number
        int count = nativeOffsetMaps.Count();
        for(int i = 0; i < count; i++)
        {
            const NativeEntryPointData::NativeOffsetMap* map = &nativeOffsetMaps.Item(i);
            uint32 statementIndex = map->statementIndex;
            if (statementIndex == 0)
            {
                // statementIndex is 0, first line in the function, populate with function line number
                pLineInfo[j].Offset = map->nativeOffsetSpan.begin;
                pLineInfo[j].LineNumber = functionLineNumber;
                j++;
            }

            lineNumber = body->GetSourceLineNumber(statementIndex);
            if (lineNumber != 0)
            {
                pLineInfo[j].Offset = map->nativeOffsetSpan.end;
                pLineInfo[j].LineNumber = lineNumber;
                j++;
            }
        }

        return j;
    }